

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

node_map * __thiscall
poplar::
compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::expand(compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
         *this)

{
  ulong uVar1;
  bool bVar2;
  undefined1 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_RSI;
  node_map *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar7;
  reverse_iterator rit;
  uint64_t new_node_id;
  type_conflict *label;
  type_conflict *parent;
  uint64_t node_id;
  uint64_t i;
  anon_class_24_3_fa13a3ba set_mapping;
  anon_class_24_3_fa13a3ba get_mapping;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  compact_vector map_high;
  size_p2 low_size;
  bit_vector done_flags;
  this_type new_ht;
  node_map *node_map;
  compact_vector *in_stack_fffffffffffffc98;
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffca0;
  compact_vector *in_stack_fffffffffffffca8;
  node_map *in_stack_fffffffffffffcb0;
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  size_type in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  pair<unsigned_long,_unsigned_long> *symb;
  unsigned_long in_stack_fffffffffffffce0;
  unsigned_long in_stack_fffffffffffffce8;
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffcf0;
  uint64_t local_288;
  pair<unsigned_long,_unsigned_long> local_280;
  type_conflict *local_270;
  type_conflict *local_268;
  pair<unsigned_long,_unsigned_long> local_260;
  type_conflict local_250;
  ulong local_248;
  undefined1 *local_240;
  pointer local_230;
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *__b;
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *__a;
  uint32_t in_stack_fffffffffffffdf4;
  uint32_t in_stack_fffffffffffffdf8;
  uint32_t in_stack_fffffffffffffdfc;
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffe00;
  undefined1 local_1c8 [112];
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_158;
  
  capa_bits((compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)0x1dda1f);
  size_p2::bits(&in_RSI->symb_size_);
  compact_bonsai_trie(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8,
                      in_stack_fffffffffffffdf4);
  add_root(&local_158);
  capa_size((compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)0x1dda76);
  bit_vector::bit_vector
            ((bit_vector *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             (uint64_t)in_stack_fffffffffffffcb8);
  get_root(in_RSI);
  bit_vector::set((bit_vector *)in_stack_fffffffffffffca0,(uint64_t)in_stack_fffffffffffffc98,false)
  ;
  uVar4 = compact_vector::width(&in_RSI->table_);
  size_p2::size_p2((size_p2 *)(local_1c8 + 0x30),uVar4);
  compact_vector::compact_vector((compact_vector *)in_stack_fffffffffffffca0);
  uVar4 = size_p2::bits((size_p2 *)(local_1c8 + 0x30));
  uVar5 = capa_bits((compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                     *)0x1ddb0b);
  if (uVar4 < uVar5) {
    capa_size((compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)0x1ddb29);
    capa_bits((compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)0x1ddb40);
    size_p2::bits((size_p2 *)(local_1c8 + 0x30));
    compact_vector::compact_vector
              ((compact_vector *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
               (uint32_t)(in_stack_fffffffffffffce0 >> 0x20));
    compact_vector::operator=((compact_vector *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
    ;
    compact_vector::~compact_vector((compact_vector *)0x1ddb96);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x1ddbf5);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
            in_stack_fffffffffffffcc8);
  pVar7.second = in_stack_fffffffffffffce0;
  pVar7.first = in_stack_fffffffffffffce8;
  __b = (compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
         *)local_1c8;
  local_240 = local_1c8;
  local_230 = (pointer)(local_1c8 + 0x30);
  local_248 = 1;
  __a = in_RSI;
  while( true ) {
    uVar1 = local_248;
    uVar6 = compact_vector::size(&in_RSI->table_);
    if (uVar6 <= uVar1) break;
    bVar2 = bit_vector::operator[]
                      ((bit_vector *)in_stack_fffffffffffffca0,(uint64_t)in_stack_fffffffffffffc98);
    if (!bVar2) {
      bVar2 = compare_dsp_(in_stack_fffffffffffffcb8,(uint64_t)in_stack_fffffffffffffcb0,
                           (uint64_t)in_stack_fffffffffffffca8);
      if (!bVar2) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::clear((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)0x1ddd1f);
        local_250 = local_248;
        do {
          pVar7 = get_parent_and_symb(in_stack_fffffffffffffcf0,pVar7.first);
          in_stack_fffffffffffffcf0 =
               (compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                *)pVar7.second;
          symb = &local_260;
          local_260 = pVar7;
          local_268 = std::get<0ul,unsigned_long,unsigned_long>
                                ((pair<unsigned_long,_unsigned_long> *)0x1ddd7c);
          local_270 = std::get<1ul,unsigned_long,unsigned_long>
                                ((pair<unsigned_long,_unsigned_long> *)0x1ddd8e);
          pVar7 = std::make_pair<unsigned_long&,unsigned_long&>
                            ((unsigned_long *)in_stack_fffffffffffffca0,
                             (unsigned_long *)in_stack_fffffffffffffc98);
          local_280 = pVar7;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffffcb0,
                     (pair<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffca8);
          local_250 = *local_268;
          uVar3 = bit_vector::operator[]
                            ((bit_vector *)in_stack_fffffffffffffca0,
                             (uint64_t)in_stack_fffffffffffffc98);
        } while (((uVar3 ^ 0xff) & 1) != 0);
        local_288 = expand::anon_class_24_3_fa13a3ba::operator()
                              ((anon_class_24_3_fa13a3ba *)in_stack_fffffffffffffcb8,
                               (uint64_t)in_stack_fffffffffffffcb0);
        std::
        rbegin<std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                  ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffc98);
        while( true ) {
          in_stack_fffffffffffffcb8 =
               (compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                *)&stack0xfffffffffffffd68;
          std::
          rend<std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                    ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffffc98);
          bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                   *)in_stack_fffffffffffffca0,
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                   *)in_stack_fffffffffffffc98);
          if (!bVar2) break;
          in_stack_fffffffffffffcb0 =
               (node_map *)
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                             *)in_stack_fffffffffffffca0);
          add_child((compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                     *)pVar7.first,(uint64_t *)pVar7.second,(uint64_t)symb);
          in_stack_fffffffffffffca8 =
               (compact_vector *)
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                             *)in_stack_fffffffffffffca0);
          expand::anon_class_24_3_fa13a3ba::operator()
                    ((anon_class_24_3_fa13a3ba *)pVar7.second,(uint64_t)symb,
                     CONCAT17(uVar3,in_stack_fffffffffffffcd0));
          in_stack_fffffffffffffca0 =
               (compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                *)std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                *)in_stack_fffffffffffffca0);
          bit_vector::set((bit_vector *)in_stack_fffffffffffffca0,
                          (uint64_t)in_stack_fffffffffffffc98,false);
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffffca0);
        }
      }
    }
    local_248 = local_248 + 1;
  }
  compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::node_map::node_map
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (compact_vector *)in_stack_fffffffffffffca0,(bit_vector *)in_stack_fffffffffffffc98);
  std::
  swap<poplar::compact_bonsai_trie<95u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>>
            (__a,__b);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffffcb0);
  compact_vector::~compact_vector((compact_vector *)0x1ddfe8);
  bit_vector::~bit_vector((bit_vector *)0x1ddff5);
  ~compact_bonsai_trie(in_stack_fffffffffffffca0);
  return in_RDI;
}

Assistant:

node_map expand() {
        // this_type new_ht{capa_bits() + 1, symb_size_.bits(), aux_cht_.capa_bits()};
        this_type new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        size_p2 low_size{table_.width()};
        compact_vector map_high;

        if (low_size.bits() < new_ht.capa_bits()) {
            map_high = compact_vector(capa_size(), new_ht.capa_bits() - low_size.bits());
        }

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        auto get_mapping = [&](uint64_t i) -> uint64_t {
            if (map_high.size() == 0) {
                return table_[i];
            } else {
                return table_[i] | (map_high[i] << low_size.bits());
            }
        };

        auto set_mapping = [&](uint64_t i, uint64_t v) {
            if (map_high.size() == 0) {
                table_.set(i, v);
            } else {
                table_.set(i, v & low_size.mask());
                map_high.set(i, v >> low_size.bits());
            }
        };

        // 0 is root
        for (uint64_t i = 1; i < table_.size(); ++i) {
            if (done_flags[i] or compare_dsp_(i, 0)) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = get_mapping(node_id);

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                set_mapping(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(map_high), std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }